

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

lys_module * ly_ctx_get_module_iter(ly_ctx *ctx,uint32_t *idx)

{
  byte bVar1;
  lys_module **pplVar2;
  lys_module *plVar3;
  LY_ERR *pLVar4;
  uint uVar5;
  
  if (idx == (uint32_t *)0x0 || ctx == (ly_ctx *)0x0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
  }
  else {
    uVar5 = *idx;
    if (uVar5 < (uint)(ctx->models).used) {
      pplVar2 = (ctx->models).list;
      do {
        plVar3 = pplVar2[uVar5];
        uVar5 = uVar5 + 1;
        bVar1 = plVar3->field_0x40;
        *idx = uVar5;
        if ((bVar1 & 0x40) == 0) {
          return plVar3;
        }
      } while (uVar5 < (uint)(ctx->models).used);
    }
  }
  return (lys_module *)0x0;
}

Assistant:

lys_module *
ly_ctx_get_module_iter(const struct ly_ctx *ctx, uint32_t *idx)
{
    if (!ctx || !idx) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    for ( ; *idx < (unsigned)ctx->models.used; (*idx)++) {
        if (!ctx->models.list[(*idx)]->disabled) {
            return ctx->models.list[(*idx)++];
        }
    }

    return NULL;
}